

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O0

void __thiscall InterpTest_Empty_Test::InterpTest_Empty_Test(InterpTest_Empty_Test *this)

{
  InterpTest_Empty_Test *this_local;
  
  InterpTest::InterpTest(&this->super_InterpTest);
  (this->super_InterpTest).super_Test._vptr_Test =
       (_func_int **)&PTR__InterpTest_Empty_Test_005c2750;
  return;
}

Assistant:

TEST_F(InterpTest, Empty) {
  ASSERT_TRUE(mod_.empty());
  ReadModule({0x00, 0x61, 0x73, 0x6d, 0x01, 0x00, 0x00, 0x00});
  Instantiate();
  ASSERT_FALSE(mod_.empty());
}